

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_color_mode_copy(LodePNGColorMode *dest,LodePNGColorMode *source)

{
  void *pvVar1;
  void *in_RSI;
  void *in_RDI;
  size_t i;
  long local_20;
  
  lodepng_color_mode_cleanup((LodePNGColorMode *)0x2aff58);
  memcpy(in_RDI,in_RSI,0x28);
  if (*(long *)((long)in_RSI + 8) != 0) {
    pvVar1 = lodepng_malloc(0x2aff86);
    *(void **)((long)in_RDI + 8) = pvVar1;
    if ((*(long *)((long)in_RDI + 8) == 0) && (*(long *)((long)in_RSI + 0x10) != 0)) {
      return 0x53;
    }
    for (local_20 = 0; local_20 != *(long *)((long)in_RSI + 0x10) << 2; local_20 = local_20 + 1) {
      *(undefined1 *)(*(long *)((long)in_RDI + 8) + local_20) =
           *(undefined1 *)(*(long *)((long)in_RSI + 8) + local_20);
    }
  }
  return 0;
}

Assistant:

unsigned lodepng_color_mode_copy(LodePNGColorMode* dest, const LodePNGColorMode* source)
{
  size_t i;
  lodepng_color_mode_cleanup(dest);
  *dest = *source;
  if(source->palette)
  {
    dest->palette = (unsigned char*)lodepng_malloc(1024);
    if(!dest->palette && source->palettesize) return 83; /*alloc fail*/
    for(i = 0; i != source->palettesize * 4; ++i) dest->palette[i] = source->palette[i];
  }
  return 0;
}